

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O3

QDebugIfHasDebugStream<QString,_QString> operator<<(QDebug debug,pair<QString,_QString> *pair)

{
  long in_RDX;
  undefined8 *puVar1;
  QTextStream *pQVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QDebugStateSaver saver;
  undefined1 *local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)pair);
  pQVar2 = (QTextStream *)(pair->first).d.d;
  pQVar2[0x30] = (QTextStream)0x0;
  QVar3.m_data = (storage_type *)0xa;
  QVar3.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar3);
  QTextStream::operator<<(pQVar2,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar2 = (QTextStream *)(pair->first).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  puVar1 = *(undefined8 **)(in_RDX + 8);
  if (puVar1 == (undefined8 *)0x0) {
    puVar1 = &QString::_empty;
  }
  QDebug::putString((QChar *)pair,(ulong)puVar1);
  pQVar2 = (QTextStream *)(pair->first).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
    pQVar2 = (QTextStream *)(pair->first).d.d;
  }
  QVar4.m_data = (storage_type *)0x2;
  QVar4.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar4);
  QTextStream::operator<<(pQVar2,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pQVar2 = (QTextStream *)(pair->first).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  puVar1 = *(undefined8 **)(in_RDX + 0x20);
  if (puVar1 == (undefined8 *)0x0) {
    puVar1 = &QString::_empty;
  }
  QDebug::putString((QChar *)pair,(ulong)puVar1);
  pQVar2 = (QTextStream *)(pair->first).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
    pQVar2 = (QTextStream *)(pair->first).d.d;
  }
  QTextStream::operator<<(pQVar2,')');
  pQVar2 = (QTextStream *)(pair->first).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
    pQVar2 = (QTextStream *)(pair->first).d.d;
  }
  (pair->first).d.d = (Data *)0x0;
  *(QTextStream **)debug.stream = pQVar2;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebugIfHasDebugStream<QString,_QString>)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebugIfHasDebugStream<T1, T2> operator<<(QDebug debug, const std::pair<T1, T2> &pair)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << "std::pair(" << pair.first << ", " << pair.second << ')';
    return debug;
}